

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O2

int enet_host_service(ENetHost *host,ENetEvent *event,enet_uint32 timeout)

{
  undefined4 uVar1;
  undefined4 uVar2;
  enet_uint32 eVar3;
  void *pvVar4;
  _func_size_t_void_ptr_enet_uint8_ptr_size_t_enet_uint8_ptr_size_t *p_Var5;
  int iVar6;
  enet_uint32 eVar7;
  int iVar8;
  uint uVar9;
  ENetChecksumCallback p_Var10;
  size_t sVar11;
  byte *pbVar12;
  enet_uint8 (*paeVar13) [4096];
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  size_t __n;
  byte *pbVar17;
  ENetPeer *local_d0;
  enet_uint32 waitCondition;
  ENetEvent *local_b8;
  ENetAddress *local_b0;
  int local_a0;
  int local_9c;
  ENetBuffer local_98 [4];
  enet_uint8 (*local_58) [4096];
  enet_uint8 (*local_50) [4096];
  enet_uint8 (*local_48) [4096];
  ENetBuffer local_40;
  
  if (event != (ENetEvent *)0x0) {
    event->type = ENET_EVENT_TYPE_NONE;
    event->peer = (ENetPeer *)0x0;
    event->packet = (ENetPacket *)0x0;
    iVar6 = enet_protocol_dispatch_incoming_commands(host,event);
    if (iVar6 == -1) {
      return -1;
    }
    if (iVar6 == 1) {
      return 1;
    }
  }
  eVar7 = enet_time_get();
  host->serviceTime = eVar7;
  iVar6 = timeout + eVar7;
  paeVar13 = host->packetData;
  local_b0 = &host->receivedAddress;
  local_58 = host->packetData + 1;
  local_b8 = event;
  local_48 = paeVar13;
  do {
    uVar14 = eVar7 - host->bandwidthThrottleEpoch;
    uVar9 = host->bandwidthThrottleEpoch - eVar7;
    if (uVar14 < 86400000) {
      uVar9 = uVar14;
    }
    if (999 < uVar9) {
      enet_host_bandwidth_throttle(host);
    }
    iVar8 = enet_protocol_send_outgoing_commands(host,event,1);
    if (iVar8 == -1) {
      return -1;
    }
    if (iVar8 == 1) {
      return 1;
    }
    local_9c = 0;
    while( true ) {
      if (local_9c == 0x100) {
        return -1;
      }
      local_40.dataLength = 0x1000;
      local_40.data = paeVar13;
      uVar9 = enet_socket_receive(host->socket,local_b0,&local_40,1);
      if ((int)uVar9 < 0) {
        return -1;
      }
      if (uVar9 == 0) break;
      host->receivedData = *paeVar13;
      uVar15 = (ulong)uVar9;
      host->receivedDataLength = uVar15;
      uVar1 = host->totalReceivedData;
      uVar2 = host->totalReceivedPackets;
      host->totalReceivedData = uVar1 + uVar9;
      host->totalReceivedPackets = uVar2 + 1;
      if (host->intercept == (ENetInterceptCallback)0x0) {
LAB_001059e2:
        if (3 < uVar15) {
          paeVar13 = (enet_uint8 (*) [4096])host->receivedData;
          uVar9 = *(uint *)*paeVar13;
          uVar14 = uVar9 << 0x18;
          uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                  uVar14 & 0xf0ffffff;
          p_Var10 = host->checksum;
          if (uVar9 == 0xffffff) {
            local_d0 = (ENetPeer *)0x0;
LAB_00105a22:
            uVar16 = (ulong)((uVar14 >> 0x1a & 2) + (uint)(p_Var10 != (ENetChecksumCallback)0x0) * 4
                            );
            __n = uVar16 + 4;
            local_50 = paeVar13;
            if ((uVar14 & 0x4000000) != 0) {
              pvVar4 = (host->compressor).context;
              if (((pvVar4 == (void *)0x0) ||
                  (p_Var5 = (host->compressor).decompress,
                  p_Var5 == (_func_size_t_void_ptr_enet_uint8_ptr_size_t_enet_uint8_ptr_size_t *)0x0
                  )) || (sVar11 = (*p_Var5)(pvVar4,*paeVar13 + __n,uVar15 - __n,*local_58 + __n,
                                            0x1000 - __n), paeVar13 = local_58, event = local_b8,
                        0x1000 - __n <= sVar11 - 1)) goto LAB_00106c1d;
              memcpy(local_58,local_50,__n);
              host->receivedData = *paeVar13;
              uVar15 = sVar11 + __n;
              host->receivedDataLength = uVar15;
              p_Var10 = host->checksum;
            }
            if (p_Var10 != (ENetChecksumCallback)0x0) {
              if (local_d0 == (ENetPeer *)0x0) {
                eVar7 = 0;
              }
              else {
                eVar7 = local_d0->connectID;
              }
              eVar3 = *(enet_uint32 *)(*paeVar13 + uVar16);
              *(enet_uint32 *)(*paeVar13 + uVar16) = eVar7;
              local_98[0].data = paeVar13;
              local_98[0].dataLength = uVar15;
              eVar7 = (*p_Var10)(local_98,1);
              event = local_b8;
              if (eVar7 != eVar3) goto LAB_00106c1d;
            }
            if (local_d0 != (ENetPeer *)0x0) {
              (local_d0->address).host = (host->receivedAddress).host;
              (local_d0->address).port = (host->receivedAddress).port;
              local_d0->incomingDataTotal =
                   local_d0->incomingDataTotal + (int)host->receivedDataLength;
            }
            pbVar17 = host->receivedData + __n;
            pbVar12 = host->receivedData + host->receivedDataLength;
            local_a0 = iVar6;
            if ((pbVar17 < pbVar12) && (pbVar17 + 4 <= pbVar12)) {
              uVar9 = *pbVar17 & 0xf;
              if (((0xf3 < (byte)((char)uVar9 - 0xdU)) && (pbVar17 + commandSizes[uVar9] <= pbVar12)
                  ) && ((local_d0 != (ENetPeer *)0x0 || ((char)uVar9 == '\x02')))) {
                *(ushort *)(pbVar17 + 2) =
                     *(ushort *)(pbVar17 + 2) << 8 | *(ushort *)(pbVar17 + 2) >> 8;
                iVar6 = (*(code *)(&DAT_00108080 + *(int *)(&DAT_00108080 + (ulong)(uVar9 - 1) * 4))
                        )();
                return iVar6;
              }
            }
            event = local_b8;
            if (local_b8 != (ENetEvent *)0x0) goto LAB_00105a75;
          }
          else if ((ulong)uVar9 < host->peerCount) {
            local_d0 = host->peer_list[uVar9];
            if ((local_d0->state != ENET_PEER_STATE_DISCONNECTED) &&
               (local_d0->state != ENET_PEER_STATE_ZOMBIE)) {
              eVar7 = (local_d0->address).host;
              if (local_b0->host == eVar7) {
                if ((local_b0->host == 0xffffffff) ||
                   ((host->receivedAddress).port == (local_d0->address).port)) {
LAB_00106bcb:
                  if ((0xfffffe < local_d0->outgoingPeerID) ||
                     ((uVar14 & 0x3000000) >> 0x18 == (uint)local_d0->incomingSessionID))
                  goto LAB_00105a22;
                }
              }
              else if (eVar7 == 0xffffffff) goto LAB_00106bcb;
            }
          }
        }
      }
      else {
        iVar8 = (*host->intercept)(host,event);
        if (iVar8 != 1) {
          if (iVar8 == -1) {
            return -1;
          }
          uVar15 = host->receivedDataLength;
          goto LAB_001059e2;
        }
        if (event == (ENetEvent *)0x0) goto LAB_00106c1d;
LAB_00105a75:
        if (event->type != ENET_EVENT_TYPE_NONE) {
          return 1;
        }
      }
LAB_00106c1d:
      local_9c = local_9c + 1;
      paeVar13 = local_48;
    }
    iVar8 = enet_protocol_send_outgoing_commands(host,event,1);
    if (iVar8 == -1) {
      return -1;
    }
    if (iVar8 == 1) {
      return 1;
    }
    if (event != (ENetEvent *)0x0) {
      iVar8 = enet_protocol_dispatch_incoming_commands(host,event);
      if (iVar8 == -1) {
        return -1;
      }
      if (iVar8 == 1) {
        return 1;
      }
    }
    if (host->serviceTime - iVar6 < 86400000) {
      return 0;
    }
    do {
      eVar7 = enet_time_get();
      host->serviceTime = eVar7;
      if (eVar7 - iVar6 < 86400000) {
        return 0;
      }
      waitCondition = 6;
      eVar3 = iVar6 - eVar7;
      if (86399999 < iVar6 - eVar7) {
        eVar3 = eVar7 - iVar6;
      }
      iVar8 = enet_socket_wait(host->socket,&waitCondition,eVar3);
      if (iVar8 != 0) {
        return -1;
      }
    } while ((waitCondition & 4) != 0);
    eVar7 = enet_time_get();
    host->serviceTime = eVar7;
    if ((waitCondition & 2) == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

int
enet_host_service (ENetHost * host, ENetEvent * event, enet_uint32 timeout)
{
    enet_uint32 waitCondition;

    if (event != NULL)
    {
        event -> type = ENET_EVENT_TYPE_NONE;
        event -> peer = NULL;
        event -> packet = NULL;

        switch (enet_protocol_dispatch_incoming_commands (host, event))
        {
        case 1:
            return 1;

        case -1:
#ifdef ENET_DEBUG
            perror ("Error dispatching incoming packets");
#endif

            return -1;

        default:
            break;
        }
    }

    host -> serviceTime = enet_time_get ();
    
    timeout += host -> serviceTime;

    do
    {
       if (ENET_TIME_DIFFERENCE (host -> serviceTime, host -> bandwidthThrottleEpoch) >= ENET_HOST_BANDWIDTH_THROTTLE_INTERVAL)
         enet_host_bandwidth_throttle (host);

       switch (enet_protocol_send_outgoing_commands (host, event, 1))
       {
       case 1:
          return 1;

       case -1:
#ifdef ENET_DEBUG
          perror ("Error sending outgoing packets");
#endif

          return -1;

       default:
          break;
       }

       switch (enet_protocol_receive_incoming_commands (host, event))
       {
       case 1:
          return 1;

       case -1:
#ifdef ENET_DEBUG
          perror ("Error receiving incoming packets");
#endif

          return -1;

       default:
          break;
       }

       switch (enet_protocol_send_outgoing_commands (host, event, 1))
       {
       case 1:
          return 1;

       case -1:
#ifdef ENET_DEBUG
          perror ("Error sending outgoing packets");
#endif

          return -1;

       default:
          break;
       }

       if (event != NULL)
       {
          switch (enet_protocol_dispatch_incoming_commands (host, event))
          {
          case 1:
             return 1;

          case -1:
#ifdef ENET_DEBUG
             perror ("Error dispatching incoming packets");
#endif

             return -1;

          default:
             break;
          }
       }

       if (ENET_TIME_GREATER_EQUAL (host -> serviceTime, timeout))
         return 0;

       do
       {
          host -> serviceTime = enet_time_get ();

          if (ENET_TIME_GREATER_EQUAL (host -> serviceTime, timeout))
            return 0;

          waitCondition = ENET_SOCKET_WAIT_RECEIVE | ENET_SOCKET_WAIT_INTERRUPT;

          if (enet_socket_wait (host -> socket, & waitCondition, ENET_TIME_DIFFERENCE (timeout, host -> serviceTime)) != 0)
            return -1;
       }
       while (waitCondition & ENET_SOCKET_WAIT_INTERRUPT);

       host -> serviceTime = enet_time_get ();
    } while (waitCondition & ENET_SOCKET_WAIT_RECEIVE);

    return 0; 
}